

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpolation.cpp
# Opt level: O3

void __thiscall
cp::interpolation<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::setInter5
          (interpolation<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *this,
          Matrix<double,_2,_1,_0,_2,_1> *xb,Matrix<double,_2,_1,_0,_2,_1> *dxb,
          Matrix<double,_2,_1,_0,_2,_1> *ddxb,Matrix<double,_2,_1,_0,_2,_1> *xe,
          Matrix<double,_2,_1,_0,_2,_1> *dxe,Matrix<double,_2,_1,_0,_2,_1> *ddxe,double t)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  dVar3 = (xb->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
          [1];
  this->a[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
       = (xb->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
         [0];
  this->a[0].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
       = dVar3;
  dVar3 = (dxb->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
          [1];
  this->a[1].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
       = (dxb->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
         [0];
  this->a[1].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
       = dVar3;
  dVar3 = (ddxb->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
          array[1];
  this->a[2].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]
       = (ddxb->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
         [0] * 0.5;
  this->a[2].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]
       = dVar3 * 0.5;
  dVar4 = t * t;
  dVar3 = pow(t,3.0);
  auVar5._0_8_ = (((xe->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                   m_data.array[0] * 20.0 -
                  (xb->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                  m_data.array[0] * 20.0) -
                 ((dxb->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                  m_data.array[0] * 12.0 +
                 (dxe->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                 m_data.array[0] * 8.0) * t) -
                 ((ddxb->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                  m_data.array[0] * 3.0 -
                 (ddxe->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                 m_data.array[0]) * dVar4;
  auVar5._8_8_ = (((xe->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                   m_data.array[1] * 20.0 -
                  (xb->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                  m_data.array[1] * 20.0) -
                 ((dxb->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                  m_data.array[1] * 12.0 +
                 (dxe->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                 m_data.array[1] * 8.0) * t) -
                 ((ddxb->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                  m_data.array[1] * 3.0 -
                 (ddxe->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                 m_data.array[1]) * dVar4;
  auVar6._8_8_ = dVar3 + dVar3;
  auVar6._0_8_ = dVar3 + dVar3;
  auVar6 = divpd(auVar5,auVar6);
  *(undefined1 (*) [16])
   this->a[3].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array =
       auVar6;
  dVar3 = pow(t,4.0);
  auVar8._0_8_ = ((ddxb->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                  m_data.array[0] * 3.0 -
                 (ddxe->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                 m_data.array[0] * 2.0) * dVar4 +
                 ((dxb->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                  m_data.array[0] * 16.0 +
                 (dxe->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                 m_data.array[0] * 14.0) * t +
                 ((xb->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                  m_data.array[0] * 30.0 -
                 (xe->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data
                 .array[0] * 30.0);
  auVar8._8_8_ = ((ddxb->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                  m_data.array[1] * 3.0 -
                 (ddxe->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                 m_data.array[1] * 2.0) * dVar4 +
                 ((dxb->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                  m_data.array[1] * 16.0 +
                 (dxe->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                 m_data.array[1] * 14.0) * t +
                 ((xb->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                  m_data.array[1] * 30.0 -
                 (xe->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data
                 .array[1] * 30.0);
  auVar1._8_8_ = dVar3 + dVar3;
  auVar1._0_8_ = dVar3 + dVar3;
  auVar6 = divpd(auVar8,auVar1);
  *(undefined1 (*) [16])
   this->a[4].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array =
       auVar6;
  dVar3 = pow(t,5.0);
  auVar7._0_8_ = (((xe->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                   m_data.array[0] * 12.0 -
                  (xb->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                  m_data.array[0] * 12.0) -
                 ((dxb->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                  m_data.array[0] * 6.0 +
                 (dxe->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                 m_data.array[0] * 6.0) * t) -
                 ((ddxb->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                  m_data.array[0] -
                 (ddxe->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                 m_data.array[0]) * dVar4;
  auVar7._8_8_ = (((xe->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                   m_data.array[1] * 12.0 -
                  (xb->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                  m_data.array[1] * 12.0) -
                 ((dxb->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                  m_data.array[1] * 6.0 +
                 (dxe->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                 m_data.array[1] * 6.0) * t) -
                 ((ddxb->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                  m_data.array[1] -
                 (ddxe->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                 m_data.array[1]) * dVar4;
  auVar2._8_8_ = dVar3 + dVar3;
  auVar2._0_8_ = dVar3 + dVar3;
  auVar6 = divpd(auVar7,auVar2);
  *(undefined1 (*) [16])
   this->a[5].super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array =
       auVar6;
  return;
}

Assistant:

void interpolation<T>::setInter5(T xb, T dxb, T ddxb, T xe, T dxe, T ddxe, double t) {
    a[0] = xb;
    a[1] = dxb;
    a[2] = ddxb * 0.5;
    a[3] = (20.0*xe - 20.0*xb - ( 8.0*dxe + 12.0*dxb)*t - (3.0*ddxb -     ddxe)*pow(t, 2)) / (2.0*pow(t, 3));
    a[4] = (30.0*xb - 30.0*xe + (14.0*dxe + 16.0*dxb)*t + (3.0*ddxb - 2.0*ddxe)*pow(t, 2)) / (2.0*pow(t, 4));
    a[5] = (12.0*xe - 12.0*xb - ( 6.0*dxe +  6.0*dxb)*t - (    ddxb -     ddxe)*pow(t, 2)) / (2.0*pow(t, 5));
}